

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  WhereMaskSet *local_30;
  WhereMaskSet *local_28;
  Bitmask mask;
  Expr *p_local;
  WhereMaskSet *pMaskSet_local;
  
  if ((p->op == 0x9e) && ((p->flags & 8) == 0)) {
    pMaskSet_local = (WhereMaskSet *)sqlite3WhereGetMask(pMaskSet,p->iTable);
  }
  else if ((p->flags & 0x804000) == 0) {
    if (p->op == 0xa7) {
      local_30 = (WhereMaskSet *)sqlite3WhereGetMask(pMaskSet,p->iTable);
    }
    else {
      local_30 = (WhereMaskSet *)0x0;
    }
    local_28 = local_30;
    if (p->pLeft != (Expr *)0x0) {
      BVar1 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
      local_28 = (WhereMaskSet *)(BVar1 | (ulong)local_30);
    }
    if (p->pRight == (Expr *)0x0) {
      if ((p->flags & 0x800) == 0) {
        if ((p->x).pList != (ExprList *)0x0) {
          BVar1 = sqlite3WhereExprListUsage(pMaskSet,(p->x).pList);
          local_28 = (WhereMaskSet *)(BVar1 | (ulong)local_28);
        }
      }
      else {
        if ((p->flags & 0x20) != 0) {
          pMaskSet->bVarSelect = 1;
        }
        BVar1 = exprSelectUsage(pMaskSet,(p->x).pSelect);
        local_28 = (WhereMaskSet *)(BVar1 | (ulong)local_28);
      }
    }
    else {
      BVar1 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
      local_28 = (WhereMaskSet *)(BVar1 | (ulong)local_28);
    }
    pMaskSet_local = local_28;
  }
  else {
    pMaskSet_local = (WhereMaskSet *)0x0;
  }
  return (Bitmask)pMaskSet_local;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
  return mask;
}